

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::anon_unknown_18::FunctionSplitter::getForwardedArgs
          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__return_storage_ptr__,
          FunctionSplitter *this,Function *func,Builder *builder)

{
  uint index;
  Builder *this_00;
  ulong uVar1;
  size_t sVar2;
  Type type;
  LocalGet *local_48 [3];
  uint local_30;
  undefined1 local_29;
  Index i;
  Builder *builder_local;
  Function *func_local;
  FunctionSplitter *this_local;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args;
  
  local_29 = 0;
  _i = builder;
  builder_local = (Builder *)func;
  func_local = (Function *)this;
  this_local = (FunctionSplitter *)__return_storage_ptr__;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (__return_storage_ptr__);
  for (local_30 = 0; uVar1 = (ulong)local_30,
      sVar2 = Function::getNumParams((Function *)builder_local), this_00 = _i, index = local_30,
      uVar1 < sVar2; local_30 = local_30 + 1) {
    type = Function::getLocalType((Function *)builder_local,local_30);
    local_48[0] = Builder::makeLocalGet(this_00,index,type);
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
              (__return_storage_ptr__,(value_type *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression*> getForwardedArgs(Function* func, Builder& builder) {
    std::vector<Expression*> args;
    for (Index i = 0; i < func->getNumParams(); i++) {
      args.push_back(builder.makeLocalGet(i, func->getLocalType(i)));
    }
    return args;
  }